

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O0

BasicBlock * __thiscall
wasm::
CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
::startBasicBlock(CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
                  *this)

{
  BasicBlock *pBVar1;
  unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock>_>
  local_18;
  CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
  *local_10;
  CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>
  *this_local;
  
  local_10 = this;
  pBVar1 = makeBasicBlock(this);
  this->currBasicBlock = pBVar1;
  std::
  unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,void>,wasm::(anonymous_namespace)::BlockInfo>::BasicBlock,std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,void>,wasm::(anonymous_namespace)::BlockInfo>::BasicBlock>>
  ::
  unique_ptr<std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,void>,wasm::(anonymous_namespace)::BlockInfo>::BasicBlock>,void>
            ((unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,void>,wasm::(anonymous_namespace)::BlockInfo>::BasicBlock,std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,void>,wasm::(anonymous_namespace)::BlockInfo>::BasicBlock>>
              *)&local_18,this->currBasicBlock);
  std::
  vector<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock>_>_>_>
  ::push_back(&this->basicBlocks,(value_type *)&local_18);
  std::
  unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>::BasicBlock>_>
  ::~unique_ptr(&local_18);
  return this->currBasicBlock;
}

Assistant:

BasicBlock* startBasicBlock() {
    currBasicBlock = ((SubType*)this)->makeBasicBlock();
    basicBlocks.push_back(std::unique_ptr<BasicBlock>(currBasicBlock));
    return currBasicBlock;
  }